

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O1

void __thiscall Js::AsmJsFunc::AddConst<int>(AsmJsFunc *this,int val)

{
  bool bVar1;
  Types type;
  RegisterSpace *this_00;
  RegSlot local_20;
  int local_1c;
  
  type = WAsmJs::FromPrimitiveType<int>();
  this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&this->mTypedRegisterAllocator,type);
  local_1c = val;
  bVar1 = JsUtil::
          BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey((BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)&this_00[1].mFirstTmpReg,&local_1c);
  if (!bVar1) {
    this_00->mNbConst = this_00->mNbConst + 1;
    local_20 = WAsmJs::RegisterSpace::AcquireRegister(this_00);
    JsUtil::
    BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::AsmJsComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::AsmJsComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::AsmJsComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this_00[1].mFirstTmpReg,&local_1c,&local_20);
  }
  return;
}

Assistant:

inline void AddConst             ( T val ){GetRegisterSpace<T>().AddConst( val );}